

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteAliasedRaw
          (CopyingOutputStreamAdaptor *this,void *data,int size)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> tree;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  void **ppvVar8;
  long *plVar9;
  int out_size;
  void *out;
  ChunkIterator CStack_100;
  CopyingOutputStreamAdaptor *pCStack_60;
  void *pvStack_58;
  ulong uStack_50;
  int local_3c;
  void *local_38 [2];
  
  uVar7 = (ulong)(uint)size;
  if (size < this->buffer_size_) {
    uStack_50 = 0x2b569c;
    iVar4 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                      (this,local_38,&local_3c);
    if ((char)iVar4 != '\0') {
      do {
        iVar4 = (int)uVar7;
        if (iVar4 <= local_3c) {
          uStack_50 = 0x2b571d;
          memcpy(local_38[0],data,(long)iVar4);
          uStack_50 = 0x2b572c;
          (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[3])
                    (this,(ulong)(uint)(local_3c - iVar4));
          return true;
        }
        uStack_50 = 0x2b56c0;
        memcpy(local_38[0],data,(long)local_3c);
        data = (void *)((long)data + (long)local_3c);
        uVar7 = (ulong)(uint)(iVar4 - local_3c);
        uStack_50 = 0x2b56d9;
        iVar4 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                          (this,local_38,&local_3c);
      } while ((char)iVar4 != '\0');
    }
    return false;
  }
  uStack_50 = 0x2b56e7;
  bVar2 = WriteBuffer(this);
  if (!bVar2) {
    return false;
  }
  uStack_50 = 0x2b56fa;
  iVar4 = (*this->copying_stream_->_vptr_CopyingOutputStream[2])(this->copying_stream_,data,uVar7);
  if ((char)iVar4 == '\0') {
    return false;
  }
  plVar9 = (long *)(ulong)(uint)this->buffer_used_;
  if (this->buffer_used_ == 0) {
    this->position_ = this->position_ + (long)size;
    return true;
  }
  ppvVar8 = local_38;
  uStack_50 = 0x2b5745;
  WriteAliasedRaw();
  CStack_100.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  CStack_100.bytes_remaining_ = 0;
  CStack_100.current_chunk_ = (string_view)ZEXT816(0);
  CStack_100.btree_reader_.remaining_ = 0;
  CStack_100.btree_reader_.navigator_.height_ = -1;
  bVar1 = *(byte *)ppvVar8;
  tree = (Nonnull<cord_internal::CordRep_*>)ppvVar8[1];
  pCStack_60 = this;
  pvStack_58 = data;
  uStack_50 = uVar7;
  if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) != 0) goto LAB_002b5863;
    CStack_100.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
    CStack_100.current_chunk_._M_str = (char *)((long)ppvVar8 + 1);
    CStack_100.current_chunk_._M_len = CStack_100.bytes_remaining_;
  }
  else {
    CStack_100.bytes_remaining_ = tree->length;
    if (CStack_100.bytes_remaining_ == 0) {
      return true;
    }
    absl::lts_20240722::Cord::ChunkIterator::InitTree(&CStack_100,tree);
  }
  if (CStack_100.bytes_remaining_ == 0) {
    return true;
  }
  sVar5 = CStack_100.current_chunk_._M_len;
  while( true ) {
    cVar3 = (**(code **)(*plVar9 + 0x28))
                      (plVar9,CStack_100.current_chunk_._M_str,sVar5 & 0xffffffff);
    if (cVar3 == '\0') {
      return false;
    }
    if (CStack_100.bytes_remaining_ == 0) break;
    sVar6 = CStack_100.bytes_remaining_ - CStack_100.current_chunk_._M_len;
    if (CStack_100.bytes_remaining_ < CStack_100.current_chunk_._M_len) goto LAB_002b5868;
    sVar5 = CStack_100.bytes_remaining_;
    CStack_100.bytes_remaining_ = sVar6;
    if (sVar6 != 0) {
      if (((long)CStack_100.btree_reader_.navigator_.height_ < 0) ||
         (CStack_100.btree_reader_.navigator_.node_[CStack_100.btree_reader_.navigator_.height_] ==
          (CordRepBtree *)0x0)) {
        if (CStack_100.current_chunk_._M_len == 0) {
          __assert_fail("!current_chunk_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                        ,0x621,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
        }
        CStack_100.current_chunk_ = (string_view)ZEXT816(0);
        sVar5 = 0;
      }
      else {
        CStack_100.current_chunk_ =
             absl::lts_20240722::cord_internal::CordRepBtreeReader::Next(&CStack_100.btree_reader_);
        sVar5 = CStack_100.current_chunk_._M_len;
      }
    }
    if (CStack_100.bytes_remaining_ == 0) {
      return (bool)cVar3;
    }
  }
  WriteCord();
LAB_002b5863:
  WriteCord();
LAB_002b5868:
  __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                ,0x61b,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteAliasedRaw(const void* data, int size) {
  if (size >= buffer_size_) {
    if (!Flush() || !copying_stream_->Write(data, size)) {
      return false;
    }
    ABSL_DCHECK_EQ(buffer_used_, 0);
    position_ += size;
    return true;
  }

  void* out;
  int out_size;
  while (true) {
    if (!Next(&out, &out_size)) {
      return false;
    }

    if (size <= out_size) {
      std::memcpy(out, data, size);
      BackUp(out_size - size);
      return true;
    }

    std::memcpy(out, data, out_size);
    data = static_cast<const char*>(data) + out_size;
    size -= out_size;
  }
  return true;
}